

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O2

ogg_int32_t toBARK(int n)

{
  int *piVar1;
  long lVar2;
  
  piVar1 = barklook;
  lVar2 = 0;
  while( true ) {
    piVar1 = piVar1 + 1;
    if (lVar2 == -0xd8000) {
      return 0xd8000;
    }
    if ((piVar1[-1] <= n) && (n < *piVar1)) break;
    lVar2 = lVar2 + -0x8000;
  }
  return ((n - piVar1[-1]) * 0x8000) / (*piVar1 - piVar1[-1]) - (int)lVar2;
}

Assistant:

STIN ogg_int32_t toBARK(int n){
  int i;
  for(i=0;i<27;i++) 
    if(n>=barklook[i] && n<barklook[i+1])break;
  
  if(i==27){
    return 27<<15;
  }else{
    int gap=barklook[i+1]-barklook[i];
    int del=n-barklook[i];

    return((i<<15)+((del<<15)/gap));
  }
}